

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

pair<const_char_*,_unsigned_long> __thiscall
naive_trie::get_longest_prefix(naive_trie *this,char *key,size_t len,size_t offset)

{
  pair<const_char_*,_unsigned_long> pVar1;
  const_iterator cVar2;
  pair<const_char_*,_unsigned_long> pVar3;
  char c;
  key_type_conflict2 local_21;
  
  pVar1.second = offset;
  pVar1.first = key;
  pVar3.second = offset;
  pVar3.first = key;
  if (len != 0 && offset != len) {
    cVar2 = llama_vocab::std::
            _Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
            ::find((_Rb_tree<char,_std::pair<const_char,_naive_trie>,_std::_Select1st<std::pair<const_char,_naive_trie>_>,_std::less<char>,_std::allocator<std::pair<const_char,_naive_trie>_>_>
                    *)this,&local_21);
    pVar3 = pVar1;
    if ((_Rb_tree_header *)cVar2._M_node != &(this->children)._M_t._M_impl.super__Rb_tree_header) {
      pVar3 = get_longest_prefix((naive_trie *)&cVar2._M_node[1]._M_parent,key,len,offset + 1);
    }
  }
  return pVar3;
}

Assistant:

std::pair<const char *, size_t> get_longest_prefix(const char * key, size_t len, size_t offset = 0) const {
        if (len == 0 || offset == len) {
            return std::make_pair(key, offset);
        }
        char c = key[offset];
        auto res = children.find(c);
        if (res != children.end()) {
            return res->second.get_longest_prefix(key, len, offset + 1);
        }

        return std::make_pair(key, offset);
    }